

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qrhiwidget.cpp
# Opt level: O2

void QRhiWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *pQVar1;
  bool bVar2;
  TextureFormat TVar3;
  QSize QVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      frameSubmitted((QRhiWidget *)_o);
      return;
    case 1:
      renderFailed((QRhiWidget *)_o);
      return;
    case 2:
      sampleCountChanged((QRhiWidget *)_o,*_a[1]);
      return;
    case 3:
      colorBufferFormatChanged((QRhiWidget *)_o,*_a[1]);
      return;
    case 4:
      fixedColorBufferSizeChanged((QRhiWidget *)_o,(QSize *)_a[1]);
      return;
    case 5:
      mirrorVerticallyChanged((QRhiWidget *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (3 < (uint)_id) {
      return;
    }
    pQVar1 = (QSize *)*_a;
    switch(_id) {
    case 0:
      TVar3 = sampleCount((QRhiWidget *)_o);
      break;
    case 1:
      TVar3 = colorBufferFormat((QRhiWidget *)_o);
      break;
    case 2:
      QVar4 = fixedColorBufferSize((QRhiWidget *)_o);
      *pQVar1 = QVar4;
      return;
    case 3:
      bVar2 = isMirrorVerticallyEnabled((QRhiWidget *)_o);
      *(bool *)&(pQVar1->wd).m_i = bVar2;
      return;
    }
    (pQVar1->wd).m_i = TVar3;
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QSize *)*_a;
      switch(_id) {
      case 0:
        setSampleCount((QRhiWidget *)_o,(pQVar1->wd).m_i);
        return;
      case 1:
        setColorBufferFormat((QRhiWidget *)_o,(pQVar1->wd).m_i);
        return;
      case 2:
        setFixedColorBufferSize((QRhiWidget *)_o,*pQVar1);
        return;
      case 3:
        setMirrorVertically((QRhiWidget *)_o,SUB41((pQVar1->wd).m_i,0));
        return;
      }
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)()>
                      ((QtMocHelpers *)_a,(void **)frameSubmitted,0,0);
    if ((((!bVar2) &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)()>
                            ((QtMocHelpers *)_a,(void **)renderFailed,0,1), !bVar2)) &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(int)>
                           ((QtMocHelpers *)_a,(void **)sampleCountChanged,0,2), !bVar2)) &&
       ((bVar2 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(QRhiWidget::TextureFormat)>
                           ((QtMocHelpers *)_a,(void **)colorBufferFormatChanged,0,3), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(QSize_const&)>
                           ((QtMocHelpers *)_a,(void **)fixedColorBufferSizeChanged,0,4), !bVar2))))
    {
      QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(bool)>
                ((QtMocHelpers *)_a,(void **)mirrorVerticallyChanged,0,5);
      return;
    }
  }
  return;
}

Assistant:

void QRhiWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QRhiWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->frameSubmitted(); break;
        case 1: _t->renderFailed(); break;
        case 2: _t->sampleCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->colorBufferFormatChanged((*reinterpret_cast< std::add_pointer_t<TextureFormat>>(_a[1]))); break;
        case 4: _t->fixedColorBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 5: _t->mirrorVerticallyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::frameSubmitted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::renderFailed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(int )>(_a, &QRhiWidget::sampleCountChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(TextureFormat )>(_a, &QRhiWidget::colorBufferFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(const QSize & )>(_a, &QRhiWidget::fixedColorBufferSizeChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(bool )>(_a, &QRhiWidget::mirrorVerticallyChanged, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->sampleCount(); break;
        case 1: *reinterpret_cast<TextureFormat*>(_v) = _t->colorBufferFormat(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->fixedColorBufferSize(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isMirrorVerticallyEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSampleCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColorBufferFormat(*reinterpret_cast<TextureFormat*>(_v)); break;
        case 2: _t->setFixedColorBufferSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setMirrorVertically(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}